

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak3.cpp
# Opt level: O1

float Cipher::findBestCutoffFreq
                (TWaveformF *waveform,EAudioFilter filterId,int64_t sampleRate,
                float minCutoffFreq_Hz,float maxCutoffFreq_Hz,float step_Hz)

{
  double dVar1;
  bool bVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  TWaveformI16 waveformInput;
  TSimilarityMap similarityMap;
  TKeyPressCollectionI16 keyPresses;
  TWaveformI16 waveformThreshold;
  TWaveformF waveformFiltered;
  vector<Cipher::TResult,_std::allocator<Cipher::TResult>_> clusteringsCur;
  TWaveformI16 waveformMax;
  float local_290;
  float local_28c;
  double local_280;
  TWaveformT<short> local_268;
  TSimilarityMap local_248;
  TKeyPressCollectionT<short> local_228;
  int64_t local_200;
  TWaveformT<short> local_1f8;
  _Hashtable<int,_std::pair<const_int,_float>,_std::allocator<std::pair<const_int,_float>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_1e0;
  TWaveformViewT<short> local_1a8;
  undefined8 local_198;
  undefined8 local_190;
  undefined8 local_188;
  void *local_180;
  undefined8 uStack_178;
  long local_170;
  vector<float,_std::allocator<float>_> local_168;
  vector<Cipher::TResult,_std::allocator<Cipher::TResult>_> local_150;
  undefined1 local_138 [16];
  pointer local_128;
  undefined8 local_120;
  undefined8 local_118;
  pointer local_110;
  pointer piStack_108;
  pointer local_100;
  TFreqMap *pTStack_f8;
  vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
  local_f0;
  vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
  vStack_d8;
  undefined1 local_c0 [32];
  double local_a0;
  double dStack_98;
  int32_t local_90;
  TProb local_8c;
  double local_88;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_80;
  pointer piStack_50;
  pointer local_48;
  pointer piStack_40;
  
  fVar3 = minCutoffFreq_Hz;
  if (minCutoffFreq_Hz <= maxCutoffFreq_Hz) {
    local_280 = -10000000000.0;
    local_290 = minCutoffFreq_Hz;
    local_28c = minCutoffFreq_Hz;
    local_200 = sampleRate;
    do {
      local_268.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_268.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_268.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      std::vector<float,_std::allocator<float>_>::vector(&local_168,waveform);
      filter<float>(&local_168,filterId,local_28c,local_200);
      bVar2 = convert<float,short>(&local_168,&local_268);
      if (bVar2) {
        local_228.super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
        super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
        local_228.super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
        super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        local_228.nClusters = 0;
        local_228.super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
        super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_228.super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
        super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ = 0;
        local_228.super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
        super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>._M_impl.
        super__Vector_impl_data._M_finish._4_4_ = 0;
        local_128 = (pointer)0x0;
        local_138._0_8_ = (pointer)0x0;
        local_138._8_8_ = (pointer)0x0;
        local_1f8.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        local_1f8.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_1f8.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_1a8.n = (long)local_268.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)local_268.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                            super__Vector_impl_data._M_start >> 1;
        local_1a8.samples =
             local_268.super__Vector_base<short,_std::allocator<short>_>._M_impl.
             super__Vector_impl_data._M_start;
        bVar2 = findKeyPresses<short>
                          (&local_1a8,&local_228,&local_1f8,(TWaveformT<short> *)local_138,8.0,0x200
                           ,0x800,true);
        if (!bVar2) {
          findBestCutoffFreq();
        }
        if (local_1f8.super__Vector_base<short,_std::allocator<short>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1f8.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1f8.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_1f8.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if ((pointer)local_138._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_138._0_8_,(long)local_128 - local_138._0_8_);
        }
        if (bVar2) {
          local_248.
          super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_248.
          super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_248.
          super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          bVar2 = calculateSimilartyMap<short>(0x200,0x80,0x180,&local_228,&local_248);
          if (bVar2) {
            local_1f8.super__Vector_base<short,_std::allocator<short>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)CONCAT44(local_1f8.super__Vector_base<short,_std::allocator<short>_>.
                                   _M_impl.super__Vector_impl_data._M_start._4_4_,0xffffffff);
            local_1f8.super__Vector_base<short,_std::allocator<short>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_1f8.super__Vector_base<short,_std::allocator<short>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 (pointer)((ulong)local_1f8.super__Vector_base<short,_std::allocator<short>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage &
                          0xffffffff00000000);
            local_1e0._M_buckets = &local_1e0._M_single_bucket;
            local_1e0._M_bucket_count = 1;
            local_1e0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
            local_1e0._M_element_count = 0;
            local_1e0._M_rehash_policy._M_max_load_factor = 1.0;
            local_1e0._M_rehash_policy._M_next_resize = 0;
            local_1e0._M_single_bucket = (__node_base_ptr)0x0;
            local_138._0_8_ = (pointer)0x2000000017;
            local_138._8_8_ = (pointer)0x64000003e8;
            local_128 = (pointer)0x3ff0000000000000;
            local_120._0_4_ = 0.0001;
            local_120._4_4_ = 0.95;
            local_118._0_4_ = 10.0;
            local_118._4_4_ = 500;
            local_c0._16_4_ = 0;
            local_c0._20_8_ = 0;
            local_c0._0_8_ = (pointer)0x0;
            local_c0._8_4_ = 0;
            local_c0._12_4_ = 0;
            vStack_d8.
            super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            vStack_d8.
            super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_f0.
            super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            vStack_d8.
            super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_f0.
            super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_f0.
            super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_100 = (pointer)0x0;
            pTStack_f8 = (TFreqMap *)0x0;
            local_110 = (pointer)0x0;
            piStack_108 = (pointer)0x0;
            local_90 = 0;
            local_a0 = 0.0;
            dStack_98 = 0.0;
            local_8c = -999.0;
            local_88 = -999.0;
            local_80._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            local_80._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            local_80._M_impl.super__Rb_tree_header._M_header._M_left =
                 &local_80._M_impl.super__Rb_tree_header._M_header;
            local_48 = (pointer)0x0;
            piStack_40 = (pointer)0x0;
            local_80._M_impl.super__Rb_tree_header._M_node_count = 0;
            piStack_50 = (pointer)0x0;
            local_1a8.n = 0x64000003e8;
            local_198 = 0x3ff0000000000000;
            local_190 = 0x3f73333338d1b717;
            local_170 = 0;
            local_180 = (void *)0x0;
            uStack_178 = 0;
            local_1a8.samples = (pointer)0x3200000017;
            local_188 = 0x1f441a00000;
            local_80._M_impl.super__Rb_tree_header._M_header._M_right =
                 local_80._M_impl.super__Rb_tree_header._M_header._M_left;
            Processor::init((Processor *)local_138,(EVP_PKEY_CTX *)&local_1a8);
            Processor::getClusterings(&local_150,(Processor *)local_138,1);
            dVar1 = (local_150.super__Vector_base<Cipher::TResult,_std::allocator<Cipher::TResult>_>
                     ._M_impl.super__Vector_impl_data._M_start)->pClusters;
            fVar3 = local_28c;
            if (dVar1 <= local_280) {
              fVar3 = local_290;
            }
            uVar4 = SUB84(dVar1,0);
            printf("    [findBestCutoffFreq] freqCutoff_Hz = %g, pClusters = %g\n",
                   SUB84((double)local_28c,0),uVar4);
            std::vector<Cipher::TResult,_std::allocator<Cipher::TResult>_>::~vector(&local_150);
            if (local_180 != (void *)0x0) {
              operator_delete(local_180,local_170 - (long)local_180);
            }
            if (piStack_50 != (pointer)0x0) {
              operator_delete(piStack_50,(long)piStack_40 - (long)piStack_50);
            }
            std::
            _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
            ::~_Rb_tree(&local_80);
            std::
            vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
            ::~vector((vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                       *)local_c0);
            std::
            vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
            ::~vector(&vStack_d8);
            std::
            vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
            ::~vector(&local_f0);
            if (local_110 != (pointer)0x0) {
              operator_delete(local_110,(long)local_100 - (long)local_110);
            }
            uVar5 = (undefined4)((ulong)dVar1 >> 0x20);
            if (dVar1 <= local_280) {
              uVar4 = SUB84(local_280,0);
              uVar5 = (undefined4)((ulong)local_280 >> 0x20);
            }
            local_280 = (double)CONCAT44(uVar5,uVar4);
            std::
            _Hashtable<int,_std::pair<const_int,_float>,_std::allocator<std::pair<const_int,_float>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::~_Hashtable(&local_1e0);
            local_290 = fVar3;
          }
          else {
            findBestCutoffFreq();
          }
          std::
          vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
          ::~vector(&local_248);
        }
        else {
          bVar2 = false;
        }
        if (local_228.super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
            super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_228.
                          super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                          .
                          super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          CONCAT44(local_228.
                                   super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                   .
                                   super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                   local_228.
                                   super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                   .
                                   super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_) -
                          (long)local_228.
                                super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                .
                                super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      else {
        findBestCutoffFreq();
        bVar2 = false;
      }
      if (local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_168.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_268.super__Vector_base<short,_std::allocator<short>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_268.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_268.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_268.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      fVar3 = minCutoffFreq_Hz;
    } while ((bVar2 != false) &&
            (local_28c = local_28c + step_Hz, fVar3 = local_290, local_28c <= maxCutoffFreq_Hz));
  }
  local_290 = fVar3;
  return local_290;
}

Assistant:

float findBestCutoffFreq(const TWaveformF & waveform, EAudioFilter filterId, int64_t sampleRate, float minCutoffFreq_Hz, float maxCutoffFreq_Hz, float step_Hz) {
        double pClustersBest = -1e10;
        float freqCutoffBest_Hz = minCutoffFreq_Hz;

        for (float freqCutoff_Hz = minCutoffFreq_Hz; freqCutoff_Hz <= maxCutoffFreq_Hz; freqCutoff_Hz += step_Hz) {
            TWaveformI16 waveformInput;
            TWaveformF waveformFiltered = waveform;
            filter(waveformFiltered, (EAudioFilter) filterId, freqCutoff_Hz, sampleRate);

            if (convert(waveformFiltered, waveformInput) == false) {
                fprintf(stderr, "%s:%d: convert() failed\n", __FILE__, __LINE__);
                return minCutoffFreq_Hz;
            }

            TKeyPressCollectionI16 keyPresses;
            {
                TWaveformI16 waveformMax;
                TWaveformI16 waveformThreshold;
                if (findKeyPresses(getView(waveformInput, 0), keyPresses, waveformThreshold, waveformMax,
                                   kFindKeysThreshold, kFindKeysHistorySize, kFindKeysHistorySizeReset, kFindKeysRemoveLowPower) == false) {
                    fprintf(stderr, "%s:%d: findKeyPresses() failed\n", __FILE__, __LINE__);
                    return minCutoffFreq_Hz;
                }
            }

            TSimilarityMap similarityMap;
            if (calculateSimilartyMap(kKeyWidth_samples, kKeyAlign_samples, kKeyWidth_samples - kKeyOffset_samples, keyPresses, similarityMap) == false) {
                fprintf(stderr, "%s:%d: calculateSimilartyMap() failed\n", __FILE__, __LINE__);
                return minCutoffFreq_Hz;
            }

            {
                Cipher::TFreqMap freqMap; // not used for anything
                Cipher::Processor processor;

                Cipher::TParameters params;
                params.maxClusters = 50;
                params.wEnglishFreq = 20.0;
                processor.init(params, freqMap, similarityMap);

                auto clusteringsCur = processor.getClusterings(1);
                if (clusteringsCur[0].pClusters > pClustersBest) {
                    pClustersBest = clusteringsCur[0].pClusters;
                    freqCutoffBest_Hz = freqCutoff_Hz;
                }
                printf("    [findBestCutoffFreq] freqCutoff_Hz = %g, pClusters = %g\n", freqCutoff_Hz, clusteringsCur[0].pClusters);
            }
        }

        return freqCutoffBest_Hz;
    }